

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int read_chunk_bytes(spng_ctx *ctx,uint32_t bytes)

{
  int iVar1;
  uint32_t uVar2;
  
  if (bytes - 1 < ctx->cur_chunk_bytes_left) {
    iVar1 = read_data(ctx,(ulong)bytes);
    if (iVar1 == 0) {
      if ((ctx->field_0xcc & 0x80) == 0) {
        uVar2 = crc32(ctx->cur_actual_crc,ctx->data,bytes);
        ctx->cur_actual_crc = uVar2;
      }
      ctx->cur_chunk_bytes_left = ctx->cur_chunk_bytes_left - bytes;
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 0x50;
  }
  return iVar1;
}

Assistant:

static int read_chunk_bytes(spng_ctx *ctx, uint32_t bytes)
{
    if(ctx == NULL) return SPNG_EINTERNAL;
    if(!ctx->cur_chunk_bytes_left || !bytes) return SPNG_EINTERNAL;
    if(bytes > ctx->cur_chunk_bytes_left) return SPNG_EINTERNAL; /* XXX: more specific error? */

    int ret;

    ret = read_data(ctx, bytes);
    if(ret) return ret;

    if(!ctx->skip_crc) ctx->cur_actual_crc = crc32(ctx->cur_actual_crc, ctx->data, bytes);

    ctx->cur_chunk_bytes_left -= bytes;

    return ret;
}